

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

uint64 crnlib::pack_etc1s_block
                 (etc1_block *dst_block,color_quad_u8 *pSrc_pixels,crn_etc1_pack_params *pack_params
                 )

{
  byte bVar1;
  int iVar2;
  int *in_RDX;
  undefined8 in_RSI;
  ulong *in_RDI;
  uint32 s;
  uint32 w;
  uint32 h;
  uint32 t;
  uint32 i;
  uint32 selector;
  int refine_high [8];
  int refine_medium [4];
  int scan [9];
  results results;
  params params;
  etc1_optimizer optimizer;
  uint8 selectors [16];
  params *in_stack_fffffffffffffde0;
  long local_218;
  uint in_stack_fffffffffffffdf0;
  uint in_stack_fffffffffffffdf4;
  uint local_208;
  uint local_200;
  uint local_1fc;
  undefined8 local_1f8 [11];
  etc1_optimizer *in_stack_fffffffffffffe60;
  ulong local_198;
  uint local_190;
  int local_18c;
  etc1_optimizer *in_stack_fffffffffffffe98;
  int local_160 [2];
  undefined4 local_158;
  undefined8 local_150;
  undefined1 local_148;
  undefined8 *local_140;
  uint local_138;
  undefined1 local_130;
  etc1_optimizer local_128;
  byte local_28 [16];
  int *local_18;
  undefined8 local_10;
  ulong *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  etc1_optimizer::etc1_optimizer(in_stack_fffffffffffffe60);
  etc1_optimizer::params::params(in_stack_fffffffffffffde0);
  local_150 = local_10;
  local_158 = 0x10;
  local_148 = 0;
  local_130 = 0;
  etc1_optimizer::results::results((results *)0x221793);
  etc1_optimizer::init(&local_128,(EVP_PKEY_CTX *)local_160);
  memcpy(local_1f8 + 6,&DAT_002510b0,0x24);
  if (*local_18 == 2) {
    local_218 = 9;
  }
  else {
    iVar2 = 1;
    if (*local_18 == 1) {
      iVar2 = 3;
    }
    local_218 = (long)iVar2;
  }
  local_138 = (uint)local_218;
  local_140 = (undefined8 *)((long)local_1f8 + (9U - local_218 & 0xfffffffffffffffe) * 2 + 0x30);
  etc1_optimizer::compute(in_stack_fffffffffffffe98);
  if ((local_160[0] != 0) && (6000 < local_198)) {
    local_1f8[4] = 0xfffffffefffffffd;
    local_1f8[5] = 0x300000002;
    local_1f8[0] = 0xfffffff9fffffff8;
    local_1f8[1] = 0xfffffffbfffffffa;
    local_1f8[2] = 0x600000005;
    local_1f8[3] = 0x800000007;
    if (local_160[0] == 1) {
      local_138 = 4;
      local_140 = local_1f8 + 4;
    }
    else {
      local_138 = 2;
      if (12000 < local_198) {
        local_138 = 8;
      }
      local_140 = (undefined8 *)((long)local_1f8 + (8 - (ulong)local_138 >> 1) * 4);
    }
    etc1_optimizer::compute(in_stack_fffffffffffffe98);
  }
  local_1fc = 0;
  local_200 = 0;
  bVar1 = 8;
  for (local_208 = 0; local_208 < 4; local_208 = local_208 + 1) {
    for (in_stack_fffffffffffffdf4 = 0; in_stack_fffffffffffffdf4 < 4;
        in_stack_fffffffffffffdf4 = in_stack_fffffffffffffdf4 + 1) {
      in_stack_fffffffffffffdf0 =
           (uint)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_28[local_200]);
      local_1fc = ((uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_28[local_200]) >>
                         1) | (in_stack_fffffffffffffdf0 & 1) << 0x10) << (bVar1 & 0xf) | local_1fc;
      bVar1 = bVar1 + 4;
      local_200 = local_200 + 1;
    }
    bVar1 = bVar1 - 0xf;
  }
  *local_8 = CONCAT44(local_1fc,local_18c << 0x1d) | (ulong)(uint)(local_18c << 0x1a) | 0x2000000 |
             (ulong)((local_190 & 0xffffff) << 3);
  etc1_optimizer::~etc1_optimizer
            ((etc1_optimizer *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  return local_198;
}

Assistant:

uint64 pack_etc1s_block(etc1_block& dst_block, const color_quad_u8* pSrc_pixels, crn_etc1_pack_params& pack_params) {
  uint8 selectors[16];
  etc1_optimizer optimizer;
  etc1_optimizer::params params;
  params.m_pSrc_pixels = pSrc_pixels;
  params.m_num_src_pixels = 16;
  params.m_use_color4 = false;
  params.m_constrain_against_base_color5 = false;
  etc1_optimizer::results results;
  results.m_pSelectors = selectors;
  results.m_n = 16;
  optimizer.init(params, results);

  const int scan[] = {-4, -3, -2, -1, 0, 1, 2, 3, 4};
  params.m_scan_delta_size = pack_params.m_quality == cCRNETCQualitySlow ? CRNLIB_ARRAY_SIZE(scan) : pack_params.m_quality == cCRNETCQualityMedium ? 3 : 1;
  params.m_pScan_deltas = scan + ((CRNLIB_ARRAY_SIZE(scan) - params.m_scan_delta_size) >> 1);
  optimizer.compute();

  if (params.m_quality >= cCRNETCQualityMedium && results.m_error > 6000) {
    const int refine_medium[] = {-3, -2, 2, 3};
    const int refine_high[] = {-8, -7, -6, -5, 5, 6, 7, 8};
    if (params.m_quality == cCRNETCQualityMedium) {
      params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(refine_medium);
      params.m_pScan_deltas = refine_medium;
    } else {
      params.m_scan_delta_size = results.m_error > 12000 ? CRNLIB_ARRAY_SIZE(refine_high) : 2;
      params.m_pScan_deltas = refine_high + ((CRNLIB_ARRAY_SIZE(refine_high) - params.m_scan_delta_size) >> 1);
    }
    optimizer.compute();
  }

  uint32 selector = 0;
  for (uint32 i = 0, t = 8, h = 0; h < 4; h++, t -= 15) {
    for (uint32 w = 0; w < 4; w++, t += 4, i++) {
      uint32 s = g_selector_index_to_etc1[selectors[i]];
      selector |= (s >> 1 | (s & 1) << 16) << (t & 15);
    }
  }

  dst_block.m_uint64 = (uint64)selector << 32 | results.m_block_inten_table << 29 | results.m_block_inten_table << 26 | 1 << 25 | (results.m_block_color_unscaled.m_u32 & 0xFFFFFF) << 3;
  return results.m_error;
}